

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_cmetrohash64_1.c
# Opt level: O0

void cmetrohash64_1_optshort(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong *in_RCX;
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t v1_16;
  uint64_t v0_16;
  uint64_t v1_15;
  uint64_t v0_15;
  uint64_t v1_14;
  uint64_t v0_14;
  uint64_t v1_13;
  uint64_t v0_13;
  uint64_t v1_12;
  uint64_t v0_12;
  uint64_t v1_11;
  uint64_t v0_11;
  uint64_t v1_10;
  uint64_t v0_10;
  uint64_t v1_9;
  uint64_t v0_9;
  uint64_t v1_8;
  uint64_t v0_8;
  uint64_t v1_7;
  uint64_t v0_7;
  uint64_t v1_6;
  uint64_t v0_6;
  uint64_t v1_5;
  uint64_t v0_5;
  uint64_t v1_4;
  uint64_t v0_4;
  uint64_t v1_3;
  uint64_t v0_3;
  uint64_t v1_2;
  uint64_t v0_2;
  uint64_t v1_1;
  uint64_t v0_1;
  uint64_t v1;
  uint64_t v0;
  uint64_t v [4];
  uint64_t hash;
  uint8_t *end;
  uint8_t *ptr;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  void *local_28;
  
  local_38 = (ulong)in_EDX * 0xc83a91e1 + in_RSI + 0x60e25d3baf065edb;
  switch(in_RSI) {
  case 1:
    uVar1 = cread_u8(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x19);
    local_38 = uVar2 * 0x8648dbdb ^ uVar1;
  case 0:
    uVar1 = crotate_right(local_38,0x21);
    uVar1 = (uVar1 ^ local_38) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 2:
    uVar1 = cread_u16(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 3:
    uVar1 = cread_u16(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 2));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 4:
    uVar1 = cread_u32(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 5:
    uVar1 = cread_u32(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u8((void *)((long)in_RDI + 4));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 6:
    uVar1 = cread_u32(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 4));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 7:
    uVar1 = cread_u32(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 4));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 6));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 8:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 9:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u8((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 10:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u16((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0xb:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u16((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 10));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0xc:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0xd:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u8((void *)((long)in_RDI + 0xc));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0xe:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 0xc));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0xf:
    uVar1 = cread_u64(in_RDI);
    uVar1 = uVar1 * 0x2f5870a5 + local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 8));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 0xc));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 0xe));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x10:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar1 = (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar1 = (uVar2 ^ uVar1) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x11:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u8((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x12:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u16((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x13:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u16((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x12));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x14:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u32((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x15:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u32((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x14));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x16:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u32((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 0x14));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x17:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u32((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 0x14));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x16));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x18:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x19:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x1a:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u16((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x1b:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u16((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x1a));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x1c:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x1d:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x1c));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x1e:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 0x1c));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  case 0x1f:
    uVar1 = cread_u64(in_RDI);
    uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
    uVar2 = cread_u64((void *)((long)in_RDI + 8));
    uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
    uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
    uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
    uVar6 = cread_u64((void *)((long)in_RDI + 0x10));
    uVar1 = uVar6 * 0x2f5870a5 +
            (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
            local_38;
    uVar2 = crotate_right(uVar1,0x21);
    uVar4 = cread_u32((void *)((long)in_RDI + 0x18));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xf);
    uVar4 = cread_u16((void *)((long)in_RDI + 0x1c));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0xd);
    uVar4 = cread_u8((void *)((long)in_RDI + 0x1e));
    uVar1 = uVar4 * 0x2f5870a5 + (uVar2 * 0x8648dbdb ^ uVar1);
    uVar2 = crotate_right(uVar1,0x19);
    uVar3 = uVar2 * 0x8648dbdb ^ uVar1;
    uVar1 = crotate_right(uVar3,0x21);
    uVar1 = (uVar1 ^ uVar3) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
    break;
  default:
    local_58 = local_38;
    local_50 = local_38;
    local_48 = local_38;
    local_40 = local_38;
    local_28 = in_RDI;
    if (0x1f < in_RSI) {
      do {
        uVar1 = cread_u64(local_28);
        uVar1 = crotate_right(uVar1 * 0xc83a91e1 + local_58,0x1d);
        local_58 = uVar1 + local_48;
        uVar1 = cread_u64((void *)((long)local_28 + 8));
        uVar1 = crotate_right(uVar1 * 0x8648dbdb + local_50,0x1d);
        local_50 = uVar1 + local_40;
        uVar1 = cread_u64((void *)((long)local_28 + 0x10));
        uVar1 = crotate_right(uVar1 * 0x7bdec03b + local_48,0x1d);
        uVar2 = cread_u64((void *)((long)local_28 + 0x18));
        local_28 = (void *)((long)local_28 + 0x20);
        uVar2 = crotate_right(uVar2 * 0x2f5870a5 + local_40,0x1d);
        local_40 = uVar2 + local_50;
        local_48 = uVar1 + local_58;
      } while (local_28 <= (void *)((long)in_RDI + (in_RSI - 0x20)));
      uVar2 = crotate_right((local_58 + local_40) * 0xc83a91e1 + local_50,0x21);
      uVar3 = uVar2 * 0x8648dbdb ^ uVar1 + local_58;
      uVar1 = crotate_right((local_50 + uVar3) * 0x8648dbdb + local_58,0x21);
      local_40 = uVar1 * 0xc83a91e1 ^ local_40;
      uVar1 = crotate_right((local_58 + uVar3) * 0xc83a91e1 + local_40,0x21);
      uVar2 = crotate_right((local_50 + local_40) * 0x8648dbdb + uVar3,0x21);
      local_38 = (uVar1 * 0x8648dbdb ^ local_58 ^ uVar2 * 0xc83a91e1 ^ local_50) + local_38;
    }
    if (0xf < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
      uVar1 = cread_u64(local_28);
      uVar1 = crotate_right(local_38 + uVar1 * 0xc83a91e1,0x21);
      uVar2 = cread_u64((void *)((long)local_28 + 8));
      local_28 = (void *)((long)local_28 + 0x10);
      uVar2 = crotate_right(local_38 + uVar2 * 0x8648dbdb,0x21);
      uVar4 = crotate_right(uVar1 * 0x6907a4ca322e467b,0x23);
      uVar5 = crotate_right(uVar2 * 0x16e8b05e33f3b607,0x23);
      local_38 = (uVar5 + (uVar4 + uVar2 * 0x7bdec03b ^ uVar1 * 0x8648dbdb) ^ uVar2 * 0x7bdec03b) +
                 local_38;
    }
    if (7 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
      uVar1 = cread_u64(local_28);
      uVar1 = uVar1 * 0x2f5870a5 + local_38;
      local_28 = (void *)((long)local_28 + 8);
      uVar2 = crotate_right(uVar1,0x21);
      local_38 = uVar2 * 0x8648dbdb ^ uVar1;
    }
    if (3 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
      uVar1 = cread_u32(local_28);
      uVar1 = uVar1 * 0x2f5870a5 + local_38;
      local_28 = (void *)((long)local_28 + 4);
      uVar2 = crotate_right(uVar1,0xf);
      local_38 = uVar2 * 0x8648dbdb ^ uVar1;
    }
    if (1 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
      uVar1 = cread_u16(local_28);
      uVar1 = uVar1 * 0x2f5870a5 + local_38;
      local_28 = (void *)((long)local_28 + 2);
      uVar2 = crotate_right(uVar1,0xd);
      local_38 = uVar2 * 0x8648dbdb ^ uVar1;
    }
    if (0 < (long)((long)in_RDI + (in_RSI - (long)local_28))) {
      uVar1 = cread_u8(local_28);
      uVar1 = uVar1 * 0x2f5870a5 + local_38;
      uVar2 = crotate_right(uVar1,0x19);
      local_38 = uVar2 * 0x8648dbdb ^ uVar1;
    }
    uVar1 = crotate_right(local_38,0x21);
    uVar1 = (uVar1 ^ local_38) * 0xc83a91e1;
    uVar2 = crotate_right(uVar1,0x21);
    *in_RCX = uVar2 ^ uVar1;
  }
  return;
}

Assistant:

void cmetrohash64_1_optshort(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;


	switch (len) {
	default:
		if (len >= 32)
		{
			uint64_t v[4];
			v[0] = hash;
			v[1] = hash;
			v[2] = hash;
			v[3] = hash;

			do
			{
				v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0], 29) + v[2];
				v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1], 29) + v[3];
				v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2], 29) + v[0];
				v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3], 29) + v[1];
			} while (ptr <= (end - 32));

			v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
			v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
			v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
			v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
			hash += v[0] ^ v[1];
		}

		if ((end - ptr) >= 16)
		{
			uint64_t v0 = hash + (cread_u64(ptr) * k0); ptr += 8; v0 = crotate_right(v0, 33) * k1;
			uint64_t v1 = hash + (cread_u64(ptr) * k1); ptr += 8; v1 = crotate_right(v1, 33) * k2;
			v0 ^= crotate_right(v0 * k0, 35) + v1;
			v1 ^= crotate_right(v1 * k3, 35) + v0;
			hash += v1;
		}

		if ((end - ptr) >= 8)
		{
			hash += cread_u64(ptr) * k3; ptr += 8;
			hash ^= crotate_right(hash, 33) * k1;

		}

		if ((end - ptr) >= 4)
		{
			hash += cread_u32(ptr) * k3; ptr += 4;
			hash ^= crotate_right(hash, 15) * k1;
		}

		if ((end - ptr) >= 2)
		{
			hash += cread_u16(ptr) * k3; ptr += 2;
			hash ^= crotate_right(hash, 13) * k1;
		}

		if ((end - ptr) >= 1)
		{
			hash += cread_u8(ptr) * k3;
			hash ^= crotate_right(hash, 25) * k1;
		}

		hash ^= crotate_right(hash, 33);
		hash *= k0;
		hash ^= crotate_right(hash, 33);

		memcpy(out, &hash, 8);
		return;

	case 31:
		DO_16
			DO_8
			DO_4
			DO_2
			DO_1
			OUT

	case 30:
		DO_16
			DO_8
			DO_4
			DO_2
			OUT

	case 29:
		DO_16
			DO_8
			DO_4
			DO_1
			OUT

	case 28:
		DO_16
			DO_8
			DO_4
			OUT

	case 27:
		DO_16
			DO_8
			DO_2
			DO_1
			OUT

	case 26:
		DO_16
			DO_8
			DO_2
			OUT

	case 25:
		DO_16
			DO_8
			DO_1
			OUT

	case 24:
		DO_16
			DO_8
			OUT

	case 23:
		DO_16
			DO_4
			DO_2
			DO_1
			OUT

	case 22:
		DO_16
			DO_4
			DO_2
			OUT


	case 21:
		DO_16
			DO_4
			DO_1
			OUT

	case 20:
		DO_16
			DO_4
			OUT

	case 19:
		DO_16
			DO_2
			DO_1
			OUT

	case 18:
		DO_16
			DO_2
			OUT

	case 17:
		DO_16
			DO_1
			OUT

	case 16:
		DO_16
			OUT

	case 15:
		DO_8
			DO_4
			DO_2
			DO_1
			OUT

	case 14:
		DO_8
			DO_4
			DO_2
			OUT

	case 13:
		DO_8
			DO_4
			DO_1
			OUT

	case 12:
		DO_8
			DO_4
			OUT

	case 11:
		DO_8
			DO_2
			DO_1
			OUT

	case 10:
		DO_8
			DO_2
			OUT

	case 9:
		DO_8
			DO_1
			OUT

	case 8:
		DO_8
			OUT
	case 7:
		DO_4
			DO_2
			DO_1
			OUT
	case 6:
		DO_4
			DO_2
			OUT
	case 5:
		DO_4
			DO_1
			OUT
	case 4:
		DO_4
			OUT
	case 3:
		DO_2
			DO_1
			OUT
	case 2:
		DO_2
			OUT
	case 1:
		DO_1

	case 0:
		OUT
	}
}